

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O1

string * __thiscall
benchmark::ToBinaryStringFullySpecified_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,double value,double threshold,
          int precision)

{
  long lVar1;
  long *plVar2;
  undefined1 in_CL;
  size_type *psVar3;
  int64_t exponent;
  string mantissa;
  benchmark *local_58;
  string local_50;
  string local_30;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ToExponentAndMantissa(value,threshold,(int)this,1024.0,&local_50,(int64_t *)&local_58);
  ExponentToPrefix_abi_cxx11_(&local_30,local_58,0,(bool)in_CL);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_30,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToBinaryStringFullySpecified(double value, double threshold,
                                         int precision) {
  std::string mantissa;
  int64_t exponent;
  ToExponentAndMantissa(value, threshold, precision, 1024.0, &mantissa,
                        &exponent);
  return mantissa + ExponentToPrefix(exponent, false);
}